

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackRecordVariableSelectionCase::iterate
          (FeedbackRecordVariableSelectionCase *this)

{
  float fVar1;
  ulong uVar2;
  char cVar3;
  int i;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  float *pfVar7;
  long lVar8;
  TestError *pTVar9;
  ulong uVar10;
  Vector<float,_4> *pVVar11;
  long lVar12;
  float fVar13;
  Vector<bool,_4> res_2;
  Vector<float,_4> res;
  Vec4 feedbackValues [3];
  VertexArray vao;
  Vector<float,_4> res_1;
  char local_23c [4];
  float local_238 [4];
  Vector<float,_4> local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  ObjectWrapper local_1f0;
  float afStack_1d8 [4];
  float afStack_1c8 [4];
  undefined1 local_1b8 [8];
  _func_int **pp_Stack_1b0;
  TestLog local_1a8 [13];
  ios_base local_140 [272];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar4);
  iVar4 = (**(code **)(lVar12 + 0x780))((this->m_program->m_program).m_program,"a_position");
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_1f0,(Functions *)CONCAT44(extraout_var_00,iVar5),traits);
  if (iVar4 == -1) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"a_position attribute location was -1","");
    tcu::TestError::TestError(pTVar9,(string *)local_1b8);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_1b8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1b0,"Rendering a patch of size 3.",0x1c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  (**(code **)(lVar12 + 0x1a00))(0,0,1,1);
  (**(code **)(lVar12 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar12 + 0x188))(0x4000);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb5f);
  (**(code **)(lVar12 + 0xd8))(local_1f0.m_object);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"bindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb62);
  (**(code **)(lVar12 + 0x1858))(0,0,0,0x3f800000,iVar4);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"vertexAttrib4f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb65);
  (**(code **)(lVar12 + 0x1680))((this->m_program->m_program).m_program);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb68);
  (**(code **)(lVar12 + 0xfd8))(0x8e72,3);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"set patch param",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb6b);
  (**(code **)(lVar12 + 0x48))(0x8c8e,0,this->m_xfbBuf);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"bind xfb buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb6e);
  (**(code **)(lVar12 + 0x30))(4);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"beginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb71);
  (**(code **)(lVar12 + 0x538))(0xe,0,3);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb74);
  (**(code **)(lVar12 + 0x638))();
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"beginTransformFeedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb77);
  local_1b8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pp_Stack_1b0,
             "Verifying the value of tf_feedback using transform feedback, expecting (3.0, 3.0, 3.0, 3.0)."
             ,0x5c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
  std::ios_base::~ios_base(local_140);
  local_208 = 0;
  uStack_200 = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_228.m_data[0] = 0.0;
  local_228.m_data[1] = 0.0;
  local_228.m_data[2] = 0.0;
  local_228.m_data[3] = 0.0;
  pfVar7 = (float *)(**(code **)(lVar12 + 0xd00))(0x8c8e,0,0x30,1);
  dVar6 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar6,"mapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0xb7f);
  if (pfVar7 == (float *)0x0) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"mapBufferRange returned null","");
    tcu::TestError::TestError(pTVar9,(string *)local_1b8);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_228.m_data._0_8_ = *(undefined8 *)pfVar7;
  local_228.m_data._8_8_ = *(undefined8 *)(pfVar7 + 2);
  local_218 = *(undefined8 *)(pfVar7 + 4);
  uStack_210 = *(undefined8 *)(pfVar7 + 6);
  local_208 = *(undefined8 *)(pfVar7 + 8);
  uStack_200 = *(undefined8 *)(pfVar7 + 10);
  cVar3 = (**(code **)(lVar12 + 0x1670))(0x8c8e);
  if (cVar3 != '\x01') {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"unmapBuffer did not return TRUE","");
    tcu::TestError::TestError(pTVar9,(string *)local_1b8);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pVVar11 = &local_228;
  lVar12 = 0;
  do {
    lVar8 = 0;
    do {
      afStack_1c8[lVar8] = 3.0;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    local_238[0] = 0.0;
    local_238[1] = 0.0;
    local_238[2] = 0.0;
    local_238[3] = 0.0;
    lVar8 = 0;
    do {
      local_238[lVar8] = pVVar11->m_data[lVar8] - afStack_1c8[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    local_1b8 = (undefined1  [8])0x0;
    pp_Stack_1b0 = (_func_int **)0x0;
    lVar8 = 0;
    do {
      fVar1 = local_238[lVar8];
      fVar13 = -fVar1;
      if (-fVar1 <= fVar1) {
        fVar13 = fVar1;
      }
      *(float *)(local_1b8 + lVar8 * 4) = fVar13;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar8 = 0;
    do {
      afStack_1d8[lVar8] = 0.001;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    local_23c[0] = '\0';
    local_23c[1] = '\0';
    local_23c[2] = '\0';
    local_23c[3] = '\0';
    lVar8 = 0;
    do {
      local_23c[lVar8] =
           *(float *)(local_1b8 + lVar8 * 4) <= afStack_1d8[lVar8] &&
           afStack_1d8[lVar8] != *(float *)(local_1b8 + lVar8 * 4);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    if (local_23c[0] == '\0') {
LAB_015d0151:
      local_1b8 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1b0,"Feedback vertex ",0x10);
      std::ostream::operator<<((ostringstream *)&pp_Stack_1b0,(int)lVar12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&pp_Stack_1b0,": expected (3.0, 3.0, 3.0, 3.0), got ",0x25);
      tcu::operator<<((ostream *)&pp_Stack_1b0,&local_228 + lVar12);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1b0);
      std::ios_base::~ios_base(local_140);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "got unexpected feedback results");
    }
    else {
      uVar2 = 0;
      do {
        uVar10 = uVar2;
        if (uVar10 == 3) break;
        uVar2 = uVar10 + 1;
      } while (local_23c[uVar10 + 1] != '\0');
      if (uVar10 < 3) goto LAB_015d0151;
    }
    lVar12 = lVar12 + 1;
    pVVar11 = pVVar11 + 1;
    if (lVar12 == 3) {
      glu::ObjectWrapper::~ObjectWrapper(&local_1f0);
      return STOP;
    }
  } while( true );
}

Assistant:

FeedbackRecordVariableSelectionCase::IterateResult FeedbackRecordVariableSelectionCase::iterate (void)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	const int				posLoc	= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const glu::VertexArray	vao		(m_context.getRenderContext());

	if (posLoc == -1)
		throw tcu::TestError("a_position attribute location was -1");

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	m_testCtx.getLog() << tcu::TestLog::Message << "Rendering a patch of size 3." << tcu::TestLog::EndMessage;

	// Render and feed back

	gl.viewport(0, 0, 1, 1);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "clear");

	gl.bindVertexArray(*vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bindVertexArray");

	gl.vertexAttrib4f(posLoc, 0.0f, 0.0f, 0.0f, 1.0f);
	GLU_EXPECT_NO_ERROR(gl.getError(), "vertexAttrib4f");

	gl.useProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "use program");

	gl.patchParameteri(GL_PATCH_VERTICES, 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "set patch param");

	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_xfbBuf);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind xfb buf");

	gl.beginTransformFeedback(GL_TRIANGLES);
	GLU_EXPECT_NO_ERROR(gl.getError(), "beginTransformFeedback");

	gl.drawArrays(GL_PATCHES, 0, 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "drawArrays");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "beginTransformFeedback");

	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying the value of tf_feedback using transform feedback, expecting (3.0, 3.0, 3.0, 3.0)." << tcu::TestLog::EndMessage;

	// Read back result (one triangle)
	{
		tcu::Vec4	feedbackValues[3];
		const void* mapPtr				= gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, (int)sizeof(feedbackValues), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "mapBufferRange");

		if (mapPtr == DE_NULL)
			throw tcu::TestError("mapBufferRange returned null");

		deMemcpy(feedbackValues, mapPtr, sizeof(feedbackValues));

		if (gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER) != GL_TRUE)
			throw tcu::TestError("unmapBuffer did not return TRUE");

		for (int ndx = 0; ndx < 3; ++ndx)
		{
			if (!tcu::boolAll(tcu::lessThan(tcu::abs(feedbackValues[ndx] - tcu::Vec4(3.0f)), tcu::Vec4(0.001f))))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Feedback vertex " << ndx << ": expected (3.0, 3.0, 3.0, 3.0), got " << feedbackValues[ndx] << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got unexpected feedback results");
			}
		}
	}

	return STOP;
}